

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setProgressRange(QFutureInterfaceBase *this,int minimum,int maximum)

{
  ProgressData *pPVar1;
  int iVar2;
  QFutureInterfaceBasePrivate *this_00;
  long in_FS_OFFSET;
  QFutureCallOutEvent local_70;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_38,&this->d->m_mutex);
  this_00 = this->d;
  pPVar1 = (this_00->m_progress).d;
  if (pPVar1 == (ProgressData *)0x0) {
    pPVar1 = (ProgressData *)operator_new(0x20);
    (pPVar1->text).d.ptr = (char16_t *)0x0;
    (pPVar1->text).d.size = 0;
    pPVar1->minimum = 0;
    pPVar1->maximum = 0;
    (pPVar1->text).d.d = (Data *)0x0;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset(&this_00->m_progress,pPVar1);
    this_00 = this->d;
    pPVar1 = (this_00->m_progress).d;
  }
  pPVar1->minimum = minimum;
  iVar2 = maximum;
  if (maximum < minimum) {
    iVar2 = minimum;
  }
  pPVar1->maximum = iVar2;
  QFutureCallOutEvent::QFutureCallOutEvent(&local_70,ProgressRange,minimum,maximum);
  QFutureInterfaceBasePrivate::sendCallOut(this_00,&local_70);
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_70);
  this->d->m_progressValue = minimum;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setProgressRange(int minimum, int maximum)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());
    d->m_progress->minimum = minimum;
    d->m_progress->maximum = qMax(minimum, maximum);
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange, minimum, maximum));
    d->m_progressValue = minimum;
}